

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.c
# Opt level: O2

void ui_wrap_text(wchar_t width,char *input,wchar_t *output_count,char ***output)

{
  byte bVar1;
  int iVar2;
  size_t sVar3;
  char **ppcVar4;
  long lVar5;
  ushort **ppuVar6;
  char *pcVar7;
  long lVar8;
  ulong uVar9;
  byte *pbVar10;
  ulong uVar11;
  size_t __n;
  int iVar12;
  bool bVar13;
  
  sVar3 = strlen(input);
  ppcVar4 = (char **)malloc(0xa0);
  *output = ppcVar4;
  for (lVar5 = 0; lVar5 != 0x14; lVar5 = lVar5 + 1) {
    (*output)[lVar5] = (char *)0x0;
  }
  iVar2 = 0;
  uVar11 = 0;
  while (lVar5 = (long)iVar2, width < (int)sVar3 - iVar2) {
    ppuVar6 = __ctype_b_loc();
    iVar12 = width + L'\x01' + iVar2;
    lVar8 = (long)(width + iVar2);
    do {
      pbVar10 = (byte *)(input + lVar8);
      iVar12 = iVar12 + -1;
      if (((*ppuVar6)[*pbVar10] >> 0xd & 1) != 0) break;
      bVar13 = lVar5 + 0x14 < lVar8;
      lVar8 = lVar8 + -1;
    } while (bVar13);
    if (((*ppuVar6)[*pbVar10] >> 0xd & 1) == 0) {
      iVar12 = width + iVar2;
    }
    __n = (size_t)(iVar12 - iVar2);
    pcVar7 = (char *)malloc(__n + 1);
    strncpy(pcVar7,input + lVar5,__n);
    pcVar7[__n] = '\0';
    (*output)[uVar11] = pcVar7;
    lVar5 = ((long)iVar12 << 0x20) + -0x100000000;
    iVar2 = iVar12 + -1;
    pbVar10 = (byte *)(input + iVar12);
    do {
      lVar5 = lVar5 + 0x100000000;
      bVar1 = *pbVar10;
      iVar2 = iVar2 + 1;
      pbVar10 = pbVar10 + 1;
    } while ((*(byte *)((long)*ppuVar6 + (ulong)bVar1 * 2 + 1) & 0x20) != 0);
    uVar9 = uVar11 + 1;
    if ((input[lVar5 >> 0x20] == '\0') || (bVar13 = 0x12 < uVar11, uVar11 = uVar9, bVar13))
    goto LAB_0010eb04;
  }
  pcVar7 = strdup(input + lVar5);
  (*output)[uVar11] = pcVar7;
  uVar9 = (ulong)((int)uVar11 + 1);
LAB_0010eb04:
  *output_count = (wchar_t)uVar9;
  return;
}

Assistant:

void ui_wrap_text(int width, const char *input, int *output_count, char ***output)
{
    const int min_width = 20, max_wrap = 20;

    int len = strlen(input);
    int input_idx, input_lidx;
    int idx, outcount;

    *output = malloc(max_wrap * sizeof(char *));
    for (idx = 0; idx < max_wrap; idx++)
	(*output)[idx] = NULL;

    input_idx = 0;
    outcount = 0;
    do {
	size_t outsize;
	char *outbuf;

	if (len - input_idx <= width) {
	    /* enough room for the rest of the input */
	    (*output)[outcount] = strdup(input + input_idx);
	    outcount++;
	    break;
	}

	/* find nearest space in input to right edge that doesn't exceed width */
	input_lidx = input_idx + width;
	while (!isspace((unsigned char)input[input_lidx]) &&
	       input_lidx - input_idx > min_width)
	    input_lidx--;
	/* didn't find a space, so just go with width-worth of characters */
	if (!isspace((unsigned char)input[input_lidx]))
	    input_lidx = input_idx + width;

	outsize = input_lidx - input_idx;
	outbuf = malloc(outsize + 1);
	strncpy(outbuf, input + input_idx, outsize);
	outbuf[outsize] = '\0';
	(*output)[outcount] = outbuf;
	outcount++;

	/* skip extra spaces in break */
	input_idx = input_lidx;
	while (isspace((unsigned char)input[input_idx]))
	    input_idx++;
    } while (input[input_idx] && outcount < max_wrap);

    *output_count = outcount;
}